

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::Next(EpsCopyInputStream *this,int overrun,int d)

{
  undefined8 uVar1;
  bool bVar2;
  int in_EDX;
  long in_RDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  char *in_stack_00000008;
  void *data;
  char *res;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  EpsCopyInputStream *in_stack_ffffffffffffff30;
  undefined8 *local_78;
  char *local_8;
  
  if (*(long *)(in_RDI + 0x10) == 0) {
    local_8 = (char *)0x0;
  }
  else if (*(long *)(in_RDI + 0x10) == in_RDI + 0x28) {
    uVar1 = (*(undefined8 **)(in_RDI + 8))[1];
    *(undefined8 *)(in_RDI + 0x28) = **(undefined8 **)(in_RDI + 8);
    *(undefined8 *)(in_RDI + 0x30) = uVar1;
    if ((*(int *)(in_RDI + 0x54) < 1) ||
       ((-1 < in_EDX &&
        (bVar2 = anon_unknown_5::ParseEndsInSlopRegion
                           (in_stack_00000008,unaff_retaddr_00,unaff_retaddr), bVar2)))) {
LAB_003ea8a6:
      if (*(long *)(in_RDI + 0x48) == 2) {
        *(long *)(in_RDI + 0x48) = *(long *)(in_RDI + 8) - (in_RDI + 0x28);
      }
      *(undefined8 *)(in_RDI + 0x10) = 0;
      *(long *)(in_RDI + 8) = in_RDI + 0x38;
      *(undefined4 *)(in_RDI + 0x18) = 0;
      local_8 = (char *)(in_RDI + 0x28);
    }
    else {
      do {
        bVar2 = StreamNext(in_stack_ffffffffffffff30,
                           (void **)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
        if (!bVar2) {
          *(undefined4 *)(in_RDI + 0x54) = 0;
          goto LAB_003ea8a6;
        }
        if (0x10 < *(int *)(in_RDI + 0x18)) {
          *(undefined8 *)(in_RDI + 0x38) = *local_78;
          *(undefined8 *)(in_RDI + 0x40) = local_78[1];
          *(undefined8 **)(in_RDI + 0x10) = local_78;
          *(long *)(in_RDI + 8) = in_RDI + 0x38;
          if (1 < *(ulong *)(in_RDI + 0x48)) {
            *(undefined8 *)(in_RDI + 0x48) = 1;
          }
          return (char *)(in_RDI + 0x28);
        }
      } while (*(int *)(in_RDI + 0x18) < 1);
      memcpy((void *)(in_RDI + 0x38),local_78,(long)*(int *)(in_RDI + 0x18));
      *(long *)(in_RDI + 0x10) = in_RDI + 0x28;
      *(long *)(in_RDI + 8) = in_RDI + 0x28 + (long)*(int *)(in_RDI + 0x18);
      if (1 < *(ulong *)(in_RDI + 0x48)) {
        *(undefined8 *)(in_RDI + 0x48) = 1;
      }
      local_8 = (char *)(in_RDI + 0x28);
    }
  }
  else {
    *(long *)(in_RDI + 8) = *(long *)(in_RDI + 0x10) + (long)*(int *)(in_RDI + 0x18) + -0x10;
    local_8 = *(char **)(in_RDI + 0x10);
    *(long *)(in_RDI + 0x10) = in_RDI + 0x28;
    if (*(long *)(in_RDI + 0x48) == 1) {
      *(undefined8 *)(in_RDI + 0x48) = 2;
    }
  }
  return local_8;
}

Assistant:

const char* EpsCopyInputStream::Next(int overrun, int d) {
  if (next_chunk_ == nullptr) return nullptr;  // We've reached end of stream.
  if (next_chunk_ != buffer_) {
    GOOGLE_DCHECK(size_ > kSlopBytes);
    // The chunk is large enough to be used directly
    buffer_end_ = next_chunk_ + size_ - kSlopBytes;
    auto res = next_chunk_;
    next_chunk_ = buffer_;
    if (aliasing_ == kOnPatch) aliasing_ = kNoDelta;
    return res;
  }
  // Move the slop bytes of previous buffer to start of the patch buffer.
  // Note we must use memmove because the previous buffer could be part of
  // buffer_.
  std::memmove(buffer_, buffer_end_, kSlopBytes);
  if (overall_limit_ > 0 &&
      (d < 0 || !ParseEndsInSlopRegion(buffer_, overrun, d))) {
    const void* data;
    // ZeroCopyInputStream indicates Next may return 0 size buffers. Hence
    // we loop.
    while (StreamNext(&data)) {
      if (size_ > kSlopBytes) {
        // We got a large chunk
        std::memcpy(buffer_ + kSlopBytes, data, kSlopBytes);
        next_chunk_ = static_cast<const char*>(data);
        buffer_end_ = buffer_ + kSlopBytes;
        if (aliasing_ >= kNoDelta) aliasing_ = kOnPatch;
        return buffer_;
      } else if (size_ > 0) {
        std::memcpy(buffer_ + kSlopBytes, data, size_);
        next_chunk_ = buffer_;
        buffer_end_ = buffer_ + size_;
        if (aliasing_ >= kNoDelta) aliasing_ = kOnPatch;
        return buffer_;
      }
      GOOGLE_DCHECK(size_ == 0) << size_;
    }
    overall_limit_ = 0;  // Next failed, no more needs for next
  }
  // End of stream or array
  if (aliasing_ == kNoDelta) {
    // If there is no more block and aliasing is true, the previous block
    // is still valid and we can alias. We have users relying on string_view's
    // obtained from protos to outlive the proto, when the parse was from an
    // array. This guarantees string_view's are always aliased if parsed from
    // an array.
    aliasing_ = reinterpret_cast<std::uintptr_t>(buffer_end_) -
                reinterpret_cast<std::uintptr_t>(buffer_);
  }
  next_chunk_ = nullptr;
  buffer_end_ = buffer_ + kSlopBytes;
  size_ = 0;
  return buffer_;
}